

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::init
          (EarlyFragmentTestsCase *this,EVP_PKEY_CTX *ctx)

{
  RenderTargetType RVar1;
  ContextInfo *pCVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  RenderTarget *pRVar5;
  NotSupportedError *pNVar6;
  long *plVar7;
  TestType TVar8;
  size_type *psVar9;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  iVar4 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x90ce);
  if (iVar4 == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"GL_MAX_FRAGMENT_IMAGE_UNIFORMS is zero","");
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_80);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_shader_image_atomic")
  ;
  if (!bVar3) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
    if (!bVar3) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Test requires OES_shader_image_atomic extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_80);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  TVar8 = this->m_type;
  RVar1 = this->m_renderTarget;
  if (RVar1 == RENDERTARGET_DEFAULT && TVar8 == TESTTYPE_DEPTH) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar5->m_depthBits == 0) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Test requires depth buffer","");
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_80);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    TVar8 = this->m_type;
    RVar1 = this->m_renderTarget;
  }
  if (TVar8 == TESTTYPE_STENCIL && RVar1 == RENDERTARGET_DEFAULT) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar5->m_stencilBits == 0) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Test requires stencil buffer","");
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_80);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    RVar1 = this->m_renderTarget;
  }
  pRVar5 = (RenderTarget *)(ulong)RVar1;
  if (RVar1 == RENDERTARGET_DEFAULT) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (0x1f < pRVar5->m_width) {
      pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
      if (0x1f < pRVar5->m_height) goto LAB_0148dca2;
    }
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_60,
                      &Functional::(anonymous_namespace)::EarlyFragmentTestsCase::RENDER_SIZE);
    std::operator+(&local_40,"Render target must have at least ",&local_60);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_80._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_80._M_dataplus._M_p == psVar9) {
      local_80.field_2._M_allocated_capacity = *psVar9;
      local_80.field_2._8_8_ = plVar7[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar9;
    }
    local_80._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_80);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0148dca2:
  return (int)pRVar5;
}

Assistant:

void init (void)
	{
		if (m_context.getContextInfo().getInt(GL_MAX_FRAGMENT_IMAGE_UNIFORMS) == 0)
			throw tcu::NotSupportedError("GL_MAX_FRAGMENT_IMAGE_UNIFORMS is zero");

		if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			throw tcu::NotSupportedError("Test requires OES_shader_image_atomic extension");

		if (m_type == TESTTYPE_DEPTH				&&
			m_renderTarget == RENDERTARGET_DEFAULT	&&
			m_context.getRenderTarget().getDepthBits() == 0)
		{
			throw tcu::NotSupportedError("Test requires depth buffer");
		}

		if (m_type == TESTTYPE_STENCIL				&&
			m_renderTarget == RENDERTARGET_DEFAULT	&&
			m_context.getRenderTarget().getStencilBits() == 0)
		{
			throw tcu::NotSupportedError("Test requires stencil buffer");
		}

		if (m_renderTarget == RENDERTARGET_DEFAULT	&&
			(m_context.getRenderTarget().getWidth() < RENDER_SIZE || m_context.getRenderTarget().getHeight() < RENDER_SIZE))
			throw tcu::NotSupportedError("Render target must have at least " + toString(RENDER_SIZE) + " width and height");
	}